

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_ispeer(nn_sock *self,int socktype)

{
  int iVar1;
  
  if (((self->socktype->protocol ^ socktype) & 0xfff0U) != 0) {
    return 0;
  }
  iVar1 = (*self->socktype->ispeer)(socktype);
  return iVar1;
}

Assistant:

int nn_sock_ispeer (struct nn_sock *self, int socktype)
{
    /*  If the peer implements a different SP protocol it is not a valid peer.
        Checking it here ensures that even if faulty protocol implementation
        allows for cross-protocol communication, it will never happen
        in practice. */
    if ((self->socktype->protocol & 0xfff0) != (socktype  & 0xfff0))
        return 0;

    /*  As long as the peer speaks the same protocol, socket type itself
        decides which socket types are to be accepted. */
    return self->socktype->ispeer (socktype);
}